

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

singletons_meta_data * es::init::static_obj_stack<es::init::singletons_meta_data>::pop(void)

{
  sequenced_ptr<es::init::singletons_meta_data> new_value;
  sequenced_ptr<es::init::singletons_meta_data> expected_value;
  bool bVar1;
  undefined8 extraout_RDX;
  sequenced_ptr<es::init::singletons_meta_data> new_top;
  sequenced_ptr<es::init::singletons_meta_data> stack_top;
  singletons_meta_data *in_stack_ffffffffffffffb8;
  singletons_meta_data *local_18 [3];
  
  memset(local_18,0,0x10);
  memset(&stack0xffffffffffffffd8,0,0x10);
  do {
    in_stack_ffffffffffffffb8 =
         (singletons_meta_data *)
         sequenced_ptr<es::init::singletons_meta_data>::load
                   ((sequenced_ptr<es::init::singletons_meta_data> *)in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffb8 == (singletons_meta_data *)0x0) {
      return (singletons_meta_data *)0x0;
    }
    expected_value._u._s._seq =
         (uint64_t)(((anon_union_16_2_61a8b2f2_for__u *)&in_stack_ffffffffffffffb8->_next)->_s)._p;
    expected_value._u._s._p = (singletons_meta_data *)extraout_RDX;
    new_value._u._s._seq = (uint64_t)in_stack_ffffffffffffffb8;
    new_value._u._s._p = (singletons_meta_data *)extraout_RDX;
    local_18[0] = in_stack_ffffffffffffffb8;
    bVar1 = sequenced_ptr<es::init::singletons_meta_data>::cas
                      ((sequenced_ptr<es::init::singletons_meta_data> *)in_stack_ffffffffffffffb8,
                       expected_value,new_value);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return local_18[0];
}

Assistant:

static T* pop()
    {
        sequenced_ptr<T> stack_top{};
        sequenced_ptr<T> new_top{};
        do
        {
            stack_top = top.load();
            if (!stack_top._u._s._p) return nullptr;
            new_top          = stack_top;
            new_top._u._s._p = stack_top._u._s._p->_next;
            ++new_top._u._s._seq;
        } while (!top.cas(stack_top, new_top));
        return stack_top._u._s._p;
    }